

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

int float128_is_signaling_nan_sparc(float128 a,float_status *status)

{
  return (int)((((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
               a.low != 0) && (a.high & 0x7fff800000000000) == 0x7fff000000000000);
}

Assistant:

int float128_is_signaling_nan(float128 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    if (snan_bit_is_one(status)) {
        return ((a.high << 1) >= 0xFFFF000000000000ULL)
            && (a.low || (a.high & 0x0000FFFFFFFFFFFFULL));
    } else {
        return (((a.high >> 47) & 0xFFFF) == 0xFFFE)
            && (a.low || (a.high & UINT64_C(0x00007FFFFFFFFFFF)));
    }
#endif
}